

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifgetobj(bifcxdef *ctx,int argc)

{
  runcxdef *prVar1;
  runsdef *prVar2;
  voccxdef *ctx_00;
  vocoldef *pvVar3;
  objnum obj;
  
  prVar1 = ctx->bifcxrun;
  prVar2 = prVar1->runcxsp;
  ctx_00 = prVar1->runcxvoc;
  prVar1->runcxsp = prVar2 + -1;
  prVar1 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\x01') {
    prVar1->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3eb);
  }
  switch(*(undefined4 *)&prVar1->runcxsp->runsv) {
  case 1:
    obj = ctx_00->voccxactor;
    if (obj == 0xffff) {
      obj = ctx_00->voccxme;
    }
    break;
  case 2:
    obj = ctx_00->voccxverb;
    break;
  case 3:
    pvVar3 = ctx_00->voccxdobj;
    goto LAB_0020ff21;
  case 4:
    obj = ctx_00->voccxprep;
    break;
  case 5:
    pvVar3 = ctx_00->voccxiobj;
LAB_0020ff21:
    if (pvVar3 == (vocoldef *)0x0) {
      obj = 0xffff;
    }
    else {
      obj = pvVar3->vocolobj;
    }
    break;
  case 6:
    obj = ctx_00->voccxit;
    break;
  case 7:
    obj = ctx_00->voccxhim;
    break;
  case 8:
    obj = ctx_00->voccxher;
    break;
  case 9:
    voc_push_objlist(ctx_00,ctx_00->voccxthm,(uint)ctx_00->voccxthc);
    return;
  default:
    prVar1->runcxerr->errcxptr->erraav[0].errastr = "parserGetObj";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x400);
  }
  runpobj(prVar1,obj);
  return;
}

Assistant:

void bifgetobj(bifcxdef *ctx, int argc)
{
    int id;
    objnum obj;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    
    /* check the argument count */
    bifcntargs(ctx, 1, argc);

    /* get the argument */
    id = (int)runpopnum(ctx->bifcxrun);

    /* get the appropriate object */
    switch(id)
    {
    case 1:
        /* get the current actor */
        obj = voc->voccxactor;

        /* if there's no current actor, use the current 'me' by default */
        if (obj == MCMONINV)
            obj = voc->voccxme;

        /* done */
        break;

    case 2:
        /* verb */
        obj = voc->voccxverb;
        break;

    case 3:
        /* direct object */
        obj = (voc->voccxdobj == 0 ? MCMONINV : voc->voccxdobj->vocolobj);
        break;

    case 4:
        /* preposition */
        obj = voc->voccxprep;
        break;

    case 5:
        /* indirect object */
        obj = (voc->voccxiobj == 0 ? MCMONINV : voc->voccxiobj->vocolobj);
        break;

    case 6:
        /* "it" */
        obj = voc->voccxit;
        break;

    case 7:
        /* "him" */
        obj = voc->voccxhim;
        break;

    case 8:
        /* "her" */
        obj = voc->voccxher;
        break;

    case 9:
        /* them */
        voc_push_objlist(voc, voc->voccxthm, voc->voccxthc);

        /* 
         *   return directly, since we've already pushed the result (it's
         *   a list, not an object) 
         */
        return;

    default:
        /* invalid argument */
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "parserGetObj");
        break;
    }

    /* return the object */
    runpobj(ctx->bifcxrun, obj);
}